

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdef.c
# Opt level: O2

void parse_tmat_senmap(mdef_t *m,char *line,long off,int p)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  uint local_450;
  int32 wlen;
  char *local_448;
  int32 s;
  char word [1024];
  
  iVar1 = __isoc99_sscanf(line + off,"%d%n",&local_450,&wlen);
  if ((iVar1 == 1) && (-1 < (int)local_450)) {
    m->phone[p].tmat = local_450;
    uVar4 = (ulong)(uint)m->n_tmat;
    uVar3 = (ulong)local_450;
    local_448 = line;
    if (m->n_tmat <= (int)local_450) {
      pcVar5 = "tmat-id(%d) > #tmat in header(%d): %s\n";
      lVar2 = 0x11c;
LAB_00133c0f:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
              ,lVar2,pcVar5,uVar3,uVar4,local_448);
      goto LAB_00133c16;
    }
    pcVar5 = line + off + wlen;
    for (local_450 = 0; (int)local_450 < m->n_emit_state; local_450 = local_450 + 1) {
      iVar1 = __isoc99_sscanf(pcVar5,"%d%n",&s,&wlen);
      if ((iVar1 != 1) || (uVar3 = (ulong)(uint)s, s < 0)) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c"
                ,0x123,"Missing or bad state[%d]->senone mapping: %s\n",(ulong)local_450,local_448);
        goto LAB_00133c16;
      }
      if ((p < m->n_ciphone) && (uVar4 = (ulong)(uint)m->n_ci_sen, m->n_ci_sen <= s)) {
        pcVar5 = "CI-senone-id(%d) > #CI-senones(%d): %s\n";
        lVar2 = 0x127;
        goto LAB_00133c0f;
      }
      uVar4 = (ulong)(uint)m->n_sen;
      if (m->n_sen <= s) {
        pcVar5 = "Senone-id(%d) > #senones(%d): %s\n";
        lVar2 = 0x12a;
        goto LAB_00133c0f;
      }
      m->sseq[p][(int)local_450] = (uint16)s;
      pcVar5 = pcVar5 + wlen;
    }
    iVar1 = __isoc99_sscanf(pcVar5,"%s%n",word,&wlen);
    if ((iVar1 == 1) && (word._0_2_ == 0x4e)) {
      iVar1 = __isoc99_sscanf(pcVar5 + wlen,"%s%n",word);
      if (iVar1 != 1) {
        return;
      }
      pcVar5 = "Non-empty beyond non-emitting final state: %s\n";
      lVar2 = 0x137;
      line = local_448;
    }
    else {
      pcVar5 = "Missing non-emitting state spec: %s\n";
      lVar2 = 0x132;
      line = local_448;
    }
  }
  else {
    pcVar5 = "Missing or bad transition matrix id: %s\n";
    lVar2 = 0x118;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/mdef.c",
          lVar2,pcVar5,line);
LAB_00133c16:
  exit(1);
}

Assistant:

static void
parse_tmat_senmap(mdef_t * m, char *line, long off, int p)
{
    int32 wlen, n, s;
    char *lp;
    __BIGSTACKVARIABLE__ char word[1024];

    lp = line + off;

    /* Read transition matrix id */
    if ((sscanf(lp, "%d%n", &n, &wlen) != 1) || (n < 0))
        E_FATAL("Missing or bad transition matrix id: %s\n", line);
    m->phone[p].tmat = n;
    if (m->n_tmat <= n)
        E_FATAL("tmat-id(%d) > #tmat in header(%d): %s\n", n, m->n_tmat,
                line);
    lp += wlen;

    /* Read senone mappings for each emitting state */
    for (n = 0; n < m->n_emit_state; n++) {
        if ((sscanf(lp, "%d%n", &s, &wlen) != 1) || (s < 0))
            E_FATAL("Missing or bad state[%d]->senone mapping: %s\n", n,
                    line);

        if ((p < m->n_ciphone) && (m->n_ci_sen <= s))
            E_FATAL("CI-senone-id(%d) > #CI-senones(%d): %s\n", s,
                    m->n_ci_sen, line);
        if (m->n_sen <= s)
            E_FATAL("Senone-id(%d) > #senones(%d): %s\n", s, m->n_sen,
                    line);

        m->sseq[p][n] = s;
        lp += wlen;
    }

    /* Check for the last non-emitting state N */
    if ((sscanf(lp, "%s%n", word, &wlen) != 1) || (strcmp(word, "N") != 0))
        E_FATAL("Missing non-emitting state spec: %s\n", line);
    lp += wlen;

    /* Check for end of line */
    if (sscanf(lp, "%s%n", word, &wlen) == 1)
        E_FATAL("Non-empty beyond non-emitting final state: %s\n", line);
}